

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O2

void __thiscall
CTcT3ExcTable::add_catch
          (CTcT3ExcTable *this,ulong protected_start_ofs,ulong protected_end_ofs,ulong exc_obj_id,
          ulong catch_block_ofs)

{
  CTcT3ExcEntry *pCVar1;
  size_t sVar2;
  
  sVar2 = this->exc_used_;
  if (sVar2 == this->exc_alloced_) {
    this->exc_alloced_ = sVar2 + 0x400;
    pCVar1 = (CTcT3ExcEntry *)realloc(this->table_,(sVar2 + 0x400) * 0x20);
    this->table_ = pCVar1;
    sVar2 = this->exc_used_;
  }
  else {
    pCVar1 = this->table_;
  }
  pCVar1[sVar2].start_ofs = protected_start_ofs - this->method_ofs_;
  pCVar1[sVar2].end_ofs = protected_end_ofs - this->method_ofs_;
  pCVar1[sVar2].exc_obj_id = exc_obj_id;
  pCVar1[sVar2].catch_ofs = catch_block_ofs - this->method_ofs_;
  this->exc_used_ = this->exc_used_ + 1;
  return;
}

Assistant:

void CTcT3ExcTable::add_catch(ulong protected_start_ofs,
                              ulong protected_end_ofs,
                              ulong exc_obj_id, ulong catch_block_ofs)
{
    CTcT3ExcEntry *entry;

    /* if necessary, expand our table */
    if (exc_used_ == exc_alloced_)
    {
        /* expand the table a bit */
        exc_alloced_ += 1024;

        /* reallocate the table at the larger size */
        table_ = (CTcT3ExcEntry *)
                 t3realloc(table_, exc_alloced_ * sizeof(table_[0]));
    }

    /* 
     *   set up the new entry - store the offsets relative to the method
     *   header start address 
     */
    entry = table_ + exc_used_;
    entry->start_ofs = protected_start_ofs - method_ofs_;
    entry->end_ofs = protected_end_ofs - method_ofs_;
    entry->exc_obj_id = exc_obj_id;
    entry->catch_ofs = catch_block_ofs - method_ofs_;

    /* consume the new entry */
    ++exc_used_;
}